

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::MemberAccessExpression::evalImpl(MemberAccessExpression *this,EvalContext *context)

{
  string_view arg;
  SourceRange range;
  SourceRange sourceRange;
  string_view memberName;
  bool bVar1;
  undefined1 uVar2;
  __optional_eq_t<unsigned_int,_unsigned_int> _Var3;
  undefined1 uVar4;
  Type *valueType_00;
  MemberAccessExpression *in_RSI;
  ConstantValue *in_RDI;
  int32_t width;
  int32_t io;
  SVInt *cvi;
  RecursiveStructMemberIterator rsmi;
  Type *currType;
  Union *unionVal;
  Type *valueType;
  FieldSymbol *field;
  ConstantValue cv;
  ConstantValue *result;
  ConstantValue *in_stack_fffffffffffffc68;
  SVInt *integer;
  EvalContext *in_stack_fffffffffffffc70;
  ConstantValue *this_00;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  SVInt *in_stack_fffffffffffffc80;
  uint32_t in_stack_fffffffffffffc8c;
  Scope *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  Type *in_stack_fffffffffffffca0;
  ConstantValue *in_stack_fffffffffffffca8;
  Diagnostic *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  Type *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  EvalContext *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  uint32_t expectedTag;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  undefined7 in_stack_fffffffffffffcf0;
  SourceLocation in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd70;
  SVInt *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  span<slang::ConstantValue,_18446744073709551615UL> local_70;
  Type *local_60;
  FieldSymbol *local_58;
  undefined4 local_50;
  
  expectedTag = (uint32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  value(in_RSI);
  Expression::eval((Expression *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbca3e4);
  if (bVar1) {
    local_58 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xbca447);
    value(in_RSI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbca489);
    local_60 = Type::getCanonicalType((Type *)in_stack_fffffffffffffc70);
    uVar2 = Type::isUnpackedStruct((Type *)0xbca4c7);
    if ((bool)uVar2) {
      local_70 = slang::ConstantValue::elements((ConstantValue *)0xbca4ea);
      std::span<slang::ConstantValue,_18446744073709551615UL>::operator[]
                (&local_70,(ulong)local_58->fieldIndex);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    }
    else {
      bVar1 = Type::isUnpackedUnion((Type *)0xbca568);
      if (bVar1) {
        slang::ConstantValue::unionVal((ConstantValue *)0xbca58e);
        CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbca5b5);
        _Var3 = std::operator==((optional<unsigned_int> *)in_stack_fffffffffffffc70,
                                (uint *)in_stack_fffffffffffffc68);
        if (_Var3) {
          CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbca602);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        }
        else {
          bVar1 = Type::isTaggedUnion((Type *)CONCAT17(in_stack_fffffffffffffc7f,
                                                       in_stack_fffffffffffffc78));
          if (bVar1) {
            range.endLoc._0_4_ = in_stack_fffffffffffffcc8;
            range.startLoc = (SourceLocation)in_stack_fffffffffffffcc0;
            range.endLoc._4_4_ = in_stack_fffffffffffffccc;
            EvalContext::addDiag
                      ((EvalContext *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                       SUB84((ulong)in_stack_fffffffffffffcd0 >> 0x20,0),range);
            arg._M_len._4_4_ = in_stack_fffffffffffffcbc;
            arg._M_len._0_4_ = in_stack_fffffffffffffcb8;
            arg._M_str = (char *)in_stack_fffffffffffffcc0;
            Diagnostic::operator<<(in_stack_fffffffffffffcb0,arg);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          }
          else {
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0xbca719);
            Type::getDefaultValue
                      ((Type *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
            CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbca747);
            bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xbca762);
            if (bVar1) {
              Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0xbca778);
              CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbca7a3);
              std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0xbca7be);
              Scope::memberAt<slang::ast::FieldSymbol>
                        (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
              ValueSymbol::getType((ValueSymbol *)0xbca7e4);
              Type::getCanonicalType((Type *)in_stack_fffffffffffffc70);
              CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0xbca822);
              RecursiveStructMemberIterator::RecursiveStructMemberIterator
                        ((RecursiveStructMemberIterator *)in_stack_fffffffffffffcd0,
                         (ConstantValue *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                         in_stack_fffffffffffffcc0);
              not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0xbca85c);
              Type::getCanonicalType((Type *)in_stack_fffffffffffffc70);
              translateUnionMembers
                        (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                         (RecursiveStructMemberIterator *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
              RecursiveStructMemberIterator::~RecursiveStructMemberIterator
                        ((RecursiveStructMemberIterator *)0xbca8a9);
            }
          }
        }
      }
      else {
        uVar4 = Type::isPackedUnion((Type *)0xbca932);
        if ((bool)uVar4) {
          valueType_00 = (Type *)slang::ConstantValue::integer((ConstantValue *)0xbca958);
          integer = (SVInt *)(in_RSI->member->name)._M_len;
          this_00 = (ConstantValue *)(in_RSI->member->name)._M_str;
          sourceRange.startLoc._7_1_ = uVar4;
          sourceRange.startLoc._0_7_ = in_stack_fffffffffffffcf0;
          sourceRange.endLoc = in_stack_fffffffffffffcf8;
          memberName._M_str = in_stack_fffffffffffffd18;
          memberName._M_len = in_stack_fffffffffffffd10;
          bVar1 = checkPackedUnionTag(valueType_00,
                                      (SVInt *)CONCAT17(in_stack_fffffffffffffce7,
                                                        in_stack_fffffffffffffce0),expectedTag,
                                      in_stack_fffffffffffffcd0,sourceRange,memberName);
          if (bVar1) {
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0xbcaa30);
            Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78))
            ;
            SVInt::slice(in_stack_fffffffffffffd78,
                         (int32_t)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                         (int32_t)in_stack_fffffffffffffd70);
            slang::ConstantValue::ConstantValue(this_00,integer);
            SVInt::~SVInt(in_stack_fffffffffffffc80);
          }
          else {
            slang::ConstantValue::ConstantValue(this_00,integer);
          }
        }
        else {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xbcaae3);
          Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
          slang::ConstantValue::integer((ConstantValue *)0xbcab12);
          SVInt::slice(in_stack_fffffffffffffd78,(int32_t)((ulong)in_stack_fffffffffffffd70 >> 0x20)
                       ,(int32_t)in_stack_fffffffffffffd70);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffc70,(SVInt *)in_stack_fffffffffffffc68);
          slang::ConstantValue::operator=
                    ((ConstantValue *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xbcab7e);
          SVInt::~SVInt(in_stack_fffffffffffffc80);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xbcab9c);
          Type::getBitWidth((Type *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xbcabc4);
          Type::isSigned((Type *)in_stack_fffffffffffffc70);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xbcabec);
          Type::isFourState((Type *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          slang::ConstantValue::convertToInt
                    ((ConstantValue *)CONCAT17(uVar2,in_stack_fffffffffffffd98),
                     (bitwidth_t)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffd90 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffd90 >> 0x10,0));
        }
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  }
  local_50 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xbcac71);
  return in_RDI;
}

Assistant:

ConstantValue MemberAccessExpression::evalImpl(EvalContext& context) const {
    ConstantValue cv = value().eval(context);
    if (!cv)
        return nullptr;

    auto& field = member.as<FieldSymbol>();
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isUnpackedStruct()) {
        return cv.elements()[field.fieldIndex];
    }
    else if (valueType.isUnpackedUnion()) {
        auto& unionVal = cv.unionVal();
        if (unionVal->activeMember == field.fieldIndex)
            return unionVal->value;

        if (valueType.isTaggedUnion()) {
            // Tagged unions can only be accessed via their active member.
            context.addDiag(diag::ConstEvalTaggedUnion, sourceRange) << member.name;
            return nullptr;
        }
        else {
            // This member isn't active, so in general it's not safe (or even
            // possible) to access it. An exception is made for the common initial
            // sequence of equivalent types, so check for that here and if found
            // translate the values across.
            ConstantValue result = type->getDefaultValue();
            if (unionVal->activeMember) {
                // Get the type of the member that is currently active.
                auto& currType = valueType.as<UnpackedUnionType>()
                                     .memberAt<FieldSymbol>(*unionVal->activeMember)
                                     .getType()
                                     .getCanonicalType();

                RecursiveStructMemberIterator rsmi(unionVal->value, currType);
                translateUnionMembers(result, type->getCanonicalType(), rsmi);
            }
            return result;
        }
    }
    else if (valueType.isPackedUnion()) {
        auto& cvi = cv.integer();
        if (!checkPackedUnionTag(valueType, cvi, field.fieldIndex, context, sourceRange,
                                 member.name)) {
            return nullptr;
        }

        return cvi.slice(int32_t(type->getBitWidth() - 1), 0);
    }
    else {
        int32_t io = (int32_t)field.bitOffset;
        int32_t width = (int32_t)type->getBitWidth();
        cv = cv.integer().slice(width + io - 1, io);

        // Make sure sign and four-statedness are correct.
        return cv.convertToInt(type->getBitWidth(), type->isSigned(), type->isFourState());
    }
}